

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-server.c
# Opt level: O0

int lws_server_socket_service_ssl(lws *wsi,lws_sockfd_type accept_fd)

{
  short sVar1;
  lws_context *context_00;
  lws_tls_ctx *plVar2;
  int iVar3;
  lws_ssl_capable_status lVar4;
  lws_context_per_thread *pt_00;
  ssize_t sVar5;
  int *piVar6;
  lws_tls_ctx *plVar7;
  lws_vhost *plStack_38;
  int n;
  lws_vhost *vh;
  lws_context_per_thread *pt;
  lws_context *context;
  lws_sockfd_type accept_fd_local;
  lws *wsi_local;
  
  context_00 = wsi->context;
  pt_00 = context_00->pt + (int)wsi->tsi;
  if ((wsi->vhost == (lws_vhost *)0x0) || ((wsi->vhost->tls).use_ssl == 0)) {
    return 0;
  }
  sVar1 = (short)wsi->wsistate;
  if (sVar1 == 0x208) {
    if ((wsi->tls).ssl != (lws_tls_conn *)0x0) {
      _lws_log(1,"%s: leaking ssl\n","lws_server_socket_service_ssl");
    }
    if (accept_fd == -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/tls-server.c"
                    ,0x8e,"int lws_server_socket_service_ssl(struct lws *, lws_sockfd_type)");
    }
    iVar3 = lws_tls_restrict_borrow(context_00);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = lws_tls_server_new_nonblocking(wsi,accept_fd);
    if (iVar3 != 0) {
      if (accept_fd != -1) {
        close(accept_fd);
      }
      lws_tls_restrict_return(context_00);
      return 1;
    }
    lwsi_set_state(wsi,0x209);
    iVar3 = __insert_wsi_socket_into_fds(context_00,wsi);
    if (iVar3 != 0) {
      _lws_log(1,"%s: failed to insert into fds\n","lws_server_socket_service_ssl");
      return 1;
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_SSL_ACCEPT,context_00->timeout_secs);
    _lws_log(0x10,"inserted SSL accept into fds, trying SSL_accept\n");
  }
  else if (sVar1 != 0x209) {
    return 0;
  }
  iVar3 = lws_change_pollfd(wsi,4,0);
  if (iVar3 != 0) {
    _lws_log(1,"%s: lws_change_pollfd failed\n","lws_server_socket_service_ssl");
    return 1;
  }
  if ((wsi->vhost->tls).allow_non_ssl_on_ssl_port != 0) {
    sVar5 = recv((wsi->desc).sockfd,pt_00->serv_buf,(ulong)context_00->pt_serv_buf_size,2);
    iVar3 = (int)sVar5;
    if ((0 < iVar3) && (0x1f < *pt_00->serv_buf)) {
      (wsi->tls).use_ssl = 0;
      lws_tls_server_abort_connection(wsi);
      (wsi->tls).ssl = (lws_tls_conn *)0x0;
      if ((wsi->vhost->options & 0x1800) == 0x1800) {
        _lws_log(8,"%s: redirecting from http to https\n","lws_server_socket_service_ssl");
        (wsi->tls).field_0x2c = (wsi->tls).field_0x2c & 0xfe | 1;
      }
      else if ((wsi->vhost->options & 0x20000000) == 0x20000000) {
        _lws_log(8,"%s: allowing unencrypted http service on tls port\n",
                 "lws_server_socket_service_ssl");
      }
      else {
        if ((wsi->vhost->options & 0x100000) != 0x100000) {
          _lws_log(4,"%s: client did not send a valid tls hello (default vhost %s)\n",
                   "lws_server_socket_service_ssl",wsi->vhost->name);
          return 1;
        }
        iVar3 = lws_http_to_fallback(wsi,(uchar *)0x0,0);
        if (iVar3 != 0) {
          return 1;
        }
        _lws_log(8,"%s: allowing non-tls fallback\n","lws_server_socket_service_ssl");
      }
      lwsi_set_state(wsi,0x119);
      return 0;
    }
    if (iVar3 == 0) {
      _lws_log(0x10,"PEEKed 0\n");
      return 1;
    }
    if ((iVar3 < 0) &&
       ((piVar6 = __errno_location(), *piVar6 == 0xb ||
        (piVar6 = __errno_location(), *piVar6 == 0xb)))) {
      iVar3 = lws_change_pollfd(wsi,0,1);
      if (iVar3 == 0) {
        _lws_log(8,"SSL_ERROR_WANT_READ\n");
        return 0;
      }
      _lws_log(8,"%s: change_pollfd failed\n","lws_server_socket_service_ssl");
      return -1;
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0;
  lws_stats_bump(pt_00,0xb,1);
  lVar4 = lws_tls_server_accept(wsi);
  _lws_log(8,"SSL_accept says %d\n",(ulong)(uint)lVar4);
  if (lVar4 == LWS_SSL_CAPABLE_ERROR) {
    lws_stats_bump(pt_00,9,1);
    _lws_log(8,"SSL_accept failed socket %u: %d\n",(ulong)(uint)(wsi->desc).sockfd,0xffffffff);
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffefff | 0x1000;
  }
  else {
    if (lVar4 != LWS_SSL_CAPABLE_DONE) {
      return 0;
    }
    lws_stats_bump(pt_00,10,1);
    for (plStack_38 = context_00->vhost_list; plStack_38 != (lws_vhost *)0x0;
        plStack_38 = plStack_38->vhost_next) {
      if (((((byte)plStack_38->field_0x2b4 >> 2 & 1) == 0) &&
          ((wsi->tls).ssl != (lws_tls_conn *)0x0)) &&
         (plVar2 = (plStack_38->tls).ssl_ctx, plVar7 = lws_tls_ctx_from_wsi(wsi), plVar2 == plVar7))
      {
        _lws_log(8,"setting wsi to vh %s\n",plStack_38->name);
        lws_vhost_bind_wsi(plStack_38,wsi);
        break;
      }
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,context_00->timeout_secs);
    lwsi_set_state(wsi,0x119);
    iVar3 = lws_tls_server_conn_alpn(wsi);
    if (iVar3 == 0) {
      _lws_log(0x10,"accepted new SSL conn\n");
      return 0;
    }
  }
  return 1;
}

Assistant:

int
lws_server_socket_service_ssl(struct lws *wsi, lws_sockfd_type accept_fd)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_vhost *vh;
	int n;

	if (!LWS_SSL_ENABLED(wsi->vhost))
		return 0;

	switch (lwsi_state(wsi)) {
	case LRS_SSL_INIT:

		if (wsi->tls.ssl)
			lwsl_err("%s: leaking ssl\n", __func__);
		if (accept_fd == LWS_SOCK_INVALID)
			assert(0);

		if (lws_tls_restrict_borrow(context))
			return 1;

		if (lws_tls_server_new_nonblocking(wsi, accept_fd)) {
			if (accept_fd != LWS_SOCK_INVALID)
				compatible_close(accept_fd);
			lws_tls_restrict_return(context);
			goto fail;
		}

#if defined(LWS_WITH_STATS)
		context->updated = 1;
#endif
		/*
		 * we are not accepted yet, but we need to enter ourselves
		 * as a live connection.  That way we can retry when more
		 * pieces come if we're not sorted yet
		 */
		lwsi_set_state(wsi, LRS_SSL_ACK_PENDING);

		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(context, wsi)) {
			lwsl_err("%s: failed to insert into fds\n", __func__);
			goto fail;
		}
		lws_pt_unlock(pt);

		lws_set_timeout(wsi, PENDING_TIMEOUT_SSL_ACCEPT,
				context->timeout_secs);

		lwsl_debug("inserted SSL accept into fds, trying SSL_accept\n");

		/* fallthru */

	case LRS_SSL_ACK_PENDING:

		if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
			lwsl_err("%s: lws_change_pollfd failed\n", __func__);
			goto fail;
		}

		if (wsi->vhost->tls.allow_non_ssl_on_ssl_port) {

			n = recv(wsi->desc.sockfd, (char *)pt->serv_buf,
				 context->pt_serv_buf_size, MSG_PEEK);

			/*
			 * We have LWS_SERVER_OPTION_ALLOW_NON_SSL_ON_SSL_PORT..
			 * this just means don't hang up on him because of no
			 * tls hello... what happens next is driven by
			 * additional option flags:
			 *
			 * none: fail the connection
			 *
			 * LWS_SERVER_OPTION_REDIRECT_HTTP_TO_HTTPS:
			 *     Destroy the TLS, issue a redirect using plaintext
			 *     http (this may not be accepted by a client that
			 *     has visited the site before and received an STS
			 *     header).
			 *
			 * LWS_SERVER_OPTION_ALLOW_HTTP_ON_HTTPS_LISTENER:
			 *     Destroy the TLS, continue and serve normally
			 *     using http
			 *
			 * LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_ACCEPT_CONFIG:
			 *     Destroy the TLS, apply whatever role and protocol
			 *     were told in the vhost info struct
			 *     .listen_accept_role / .listen_accept_protocol and
			 *     continue with that
			 */

			if (n >= 1 && pt->serv_buf[0] >= ' ') {
				/*
				* TLS content-type for Handshake is 0x16, and
				* for ChangeCipherSpec Record, it's 0x14
				*
				* A non-ssl session will start with the HTTP
				* method in ASCII.  If we see it's not a legit
				* SSL handshake kill the SSL for this
				* connection and try to handle as a HTTP
				* connection upgrade directly.
				*/
				wsi->tls.use_ssl = 0;

				lws_tls_server_abort_connection(wsi);
				/*
				 * care... this creates wsi with no ssl when ssl
				 * is enabled and normally mandatory
				 */
				wsi->tls.ssl = NULL;

				if (lws_check_opt(wsi->vhost->options,
				    LWS_SERVER_OPTION_REDIRECT_HTTP_TO_HTTPS)) {
					lwsl_info("%s: redirecting from http "
						  "to https\n", __func__);
					wsi->tls.redirect_to_https = 1;
					goto notls_accepted;
				}

				if (lws_check_opt(wsi->vhost->options,
				LWS_SERVER_OPTION_ALLOW_HTTP_ON_HTTPS_LISTENER)) {
					lwsl_info("%s: allowing unencrypted "
						  "http service on tls port\n",
						  __func__);
					goto notls_accepted;
				}

				if (lws_check_opt(wsi->vhost->options,
		    LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_ACCEPT_CONFIG)) {
					if (lws_http_to_fallback(wsi, NULL, 0))
						goto fail;
					lwsl_info("%s: allowing non-tls "
						  "fallback\n", __func__);
					goto notls_accepted;
				}

				lwsl_notice("%s: client did not send a valid "
					    "tls hello (default vhost %s)\n",
					    __func__, wsi->vhost->name);
				goto fail;
			}
			if (!n) {
				/*
				 * connection is gone, fail out
				 */
				lwsl_debug("PEEKed 0\n");
				goto fail;
			}
			if (n < 0 && (LWS_ERRNO == LWS_EAGAIN ||
				      LWS_ERRNO == LWS_EWOULDBLOCK)) {
				/*
				 * well, we get no way to know ssl or not
				 * so go around again waiting for something
				 * to come and give us a hint, or timeout the
				 * connection.
				 */
				if (lws_change_pollfd(wsi, 0, LWS_POLLIN)) {
					lwsl_info("%s: change_pollfd failed\n",
						  __func__);
					return -1;
				}

				lwsl_info("SSL_ERROR_WANT_READ\n");
				return 0;
			}
		}

		/* normal SSL connection processing path */

#if defined(LWS_WITH_STATS)
		/* only set this the first time around */
		if (!wsi->accept_start_us)
			wsi->accept_start_us = lws_now_usecs();
#endif
		errno = 0;
		lws_stats_bump(pt, LWSSTATS_C_SSL_ACCEPT_SPIN, 1);
		n = lws_tls_server_accept(wsi);
		lwsl_info("SSL_accept says %d\n", n);
		switch (n) {
		case LWS_SSL_CAPABLE_DONE:
			break;
		case LWS_SSL_CAPABLE_ERROR:
			lws_stats_bump(pt, LWSSTATS_C_SSL_CONNECTIONS_FAILED, 1);
	                lwsl_info("SSL_accept failed socket %u: %d\n",
	                		wsi->desc.sockfd, n);
			wsi->socket_is_permanently_unusable = 1;
			goto fail;

		default: /* MORE_SERVICE */
			return 0;
		}

		lws_stats_bump(pt, LWSSTATS_C_SSL_CONNECTIONS_ACCEPTED, 1);
#if defined(LWS_WITH_STATS)
		if (wsi->accept_start_us)
			lws_stats_bump(pt,
				      LWSSTATS_US_SSL_ACCEPT_LATENCY_AVG,
				      lws_now_usecs() -
					      wsi->accept_start_us);
		wsi->accept_start_us = lws_now_usecs();
#endif
#if defined(LWS_WITH_DETAILED_LATENCY)
		if (context->detailed_latency_cb) {
			wsi->detlat.type = LDLT_TLS_NEG_SERVER;
			wsi->detlat.latencies[LAT_DUR_PROXY_RX_TO_ONWARD_TX] =
				lws_now_usecs() -
				wsi->detlat.earliest_write_req_pre_write;
			wsi->detlat.latencies[LAT_DUR_USERCB] = 0;
			lws_det_lat_cb(wsi->context, &wsi->detlat);
		}
#endif

		/* adapt our vhost to match the SNI SSL_CTX that was chosen */
		vh = context->vhost_list;
		while (vh) {
			if (!vh->being_destroyed && wsi->tls.ssl &&
			    vh->tls.ssl_ctx == lws_tls_ctx_from_wsi(wsi)) {
				lwsl_info("setting wsi to vh %s\n", vh->name);
				lws_vhost_bind_wsi(vh, wsi);
				break;
			}
			vh = vh->vhost_next;
		}

		/* OK, we are accepted... give him some time to negotiate */
		lws_set_timeout(wsi, PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,
				context->timeout_secs);

		lwsi_set_state(wsi, LRS_ESTABLISHED);
		if (lws_tls_server_conn_alpn(wsi))
			goto fail;
		lwsl_debug("accepted new SSL conn\n");
		break;

	default:
		break;
	}

	return 0;

notls_accepted:
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	return 0;

fail:
	return 1;
}